

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::
RemoveCurrent<Memory::HeapAllocator>(EditingIterator *this,HeapAllocator *allocator)

{
  DListNode<Memory::Recycler::GuestArenaAllocator> *obj;
  code *pcVar1;
  bool bVar2;
  DListNodeBase<Memory::Recycler::GuestArenaAllocator> *pDVar3;
  undefined8 *in_FS_OFFSET;
  NodeBase *node;
  NodeBase *last;
  HeapAllocator *allocator_local;
  EditingIterator *this_local;
  
  if ((this->super_Iterator).current == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x94,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  bVar2 = IsHead((this->super_Iterator).list,(this->super_Iterator).current);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x95,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pDVar3 = DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Prev
                     ((this->super_Iterator).current);
  obj = (DListNode<Memory::Recycler::GuestArenaAllocator> *)(this->super_Iterator).current;
  RemoveNode((NodeBase *)obj);
  Memory::
  DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::Recycler::GuestArenaAllocator>>
            (allocator,obj);
  (this->super_Iterator).current = pDVar3;
  RealCount::DecrementCount(&((this->super_Iterator).list)->super_RealCount);
  return;
}

Assistant:

void RemoveCurrent(TAllocator * allocator)
        {
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));

            NodeBase * last = this->current->Prev();
            NodeBase * node = const_cast<NodeBase *>(this->current);
            DListBase::RemoveNode(node);
            AllocatorDelete(TAllocator, allocator, (Node *)node);
            this->current = last;
            const_cast<DListBase *>(this->list)->DecrementCount();
        }